

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTiming.c
# Opt level: O1

void Aig_ManUpdateLevel(Aig_Man_t *p,Aig_Obj_t *pObjNew)

{
  ulong uVar1;
  ulong uVar2;
  Vec_Ptr_t *pVVar3;
  uint uVar4;
  Vec_Vec_t *pVVar5;
  void **ppvVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  void *Entry;
  
  if (p->pFanData == (int *)0x0) {
    __assert_fail("p->pFanData != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTiming.c"
                  ,199,"void Aig_ManUpdateLevel(Aig_Man_t *, Aig_Obj_t *)");
  }
  if ((*(uint *)&pObjNew->field_0x18 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pObjNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTiming.c"
                  ,200,"void Aig_ManUpdateLevel(Aig_Man_t *, Aig_Obj_t *)");
  }
  if (p->vLevels == (Vec_Vec_t *)0x0) {
    uVar4 = Aig_ManLevels(p);
    pVVar5 = (Vec_Vec_t *)malloc(0x10);
    iVar10 = 8;
    if (uVar4 < 0xfffffff9) {
      iVar10 = uVar4 + 8;
    }
    pVVar5->nSize = 0;
    pVVar5->nCap = iVar10;
    if (iVar10 == 0) {
      ppvVar6 = (void **)0x0;
    }
    else {
      ppvVar6 = (void **)malloc((long)iVar10 << 3);
    }
    pVVar5->pArray = ppvVar6;
    p->vLevels = pVVar5;
  }
  if (((ulong)pObjNew & 1) != 0) {
LAB_006cab39:
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                  ,0x143,"int Aig_ObjLevel(Aig_Obj_t *)");
  }
  uVar9 = (uint)((ulong)*(undefined8 *)&pObjNew->field_0x18 >> 0x20);
  uVar4 = uVar9 & 0xffffff;
  uVar7 = (ulong)pObjNew->pFanin1 & 0xfffffffffffffffe;
  if (uVar7 == 0) {
    uVar13 = *(uint *)(((ulong)pObjNew->pFanin0 & 0xfffffffffffffffe) + 0x1c) & 0xffffff;
  }
  else {
    uVar8 = *(uint *)(((ulong)pObjNew->pFanin0 & 0xfffffffffffffffe) + 0x1c) & 0xffffff;
    uVar13 = *(uint *)(uVar7 + 0x1c) & 0xffffff;
    if (uVar13 < uVar8) {
      uVar13 = uVar8;
    }
    uVar13 = (((uint)*(undefined8 *)&pObjNew->field_0x18 & 7) == 6) + uVar13 + 1;
  }
  if (uVar4 != uVar13) {
    pVVar5 = p->vLevels;
    iVar10 = pVVar5->nSize;
    if (0 < (long)iVar10) {
      ppvVar6 = pVVar5->pArray;
      lVar12 = 0;
      do {
        *(undefined4 *)((long)ppvVar6[lVar12] + 4) = 0;
        lVar12 = lVar12 + 1;
      } while (iVar10 != lVar12);
    }
    Vec_VecPush(pVVar5,uVar4,pObjNew);
    pObjNew->field_0x18 = pObjNew->field_0x18 | 0x10;
    if ((int)uVar4 < p->vLevels->nSize) {
      uVar7 = (ulong)(uVar9 & 0xffffff);
      uVar4 = 0xffffffff;
      do {
        pVVar5 = p->vLevels;
        if ((long)pVVar5->nSize <= (long)uVar7) {
LAB_006cab96:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                        ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
        }
        lVar12 = 0;
        while (lVar12 < *(int *)((long)pVVar5->pArray[uVar7] + 4)) {
          uVar1 = *(ulong *)(*(long *)((long)pVVar5->pArray[uVar7] + 8) + lVar12 * 8);
          uVar2 = *(ulong *)(uVar1 + 0x18);
          *(ulong *)(uVar1 + 0x18) = uVar2 & 0xffffffffffffffef;
          if ((uVar1 & 1) != 0) goto LAB_006cab39;
          if (((uint)(uVar2 >> 0x20) & 0xffffff) != uVar7) {
            __assert_fail("Aig_ObjLevel(pTemp) == Lev",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTiming.c"
                          ,0xda,"void Aig_ManUpdateLevel(Aig_Man_t *, Aig_Obj_t *)");
          }
          uVar11 = *(ulong *)(uVar1 + 0x10) & 0xfffffffffffffffe;
          if (uVar11 == 0) {
            uVar9 = *(uint *)((*(ulong *)(uVar1 + 8) & 0xfffffffffffffffe) + 0x1c);
          }
          else {
            uVar13 = *(uint *)((*(ulong *)(uVar1 + 8) & 0xfffffffffffffffe) + 0x1c) & 0xffffff;
            uVar9 = *(uint *)(uVar11 + 0x1c) & 0xffffff;
            if (uVar9 < uVar13) {
              uVar9 = uVar13;
            }
            uVar9 = uVar9 + (((uint)uVar2 & 7) == 6) + 1;
          }
          *(ulong *)(uVar1 + 0x18) = uVar2 & 0xff000000ffffffef | (ulong)(uVar9 & 0xffffff) << 0x20;
          if (uVar7 != (uVar9 & 0xffffff)) {
            if (p->pFanData == (int *)0x0) {
              __assert_fail("p->pFanData",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTiming.c"
                            ,0xe0,"void Aig_ManUpdateLevel(Aig_Man_t *, Aig_Obj_t *)");
            }
            if ((*(uint *)(uVar1 + 0x18) & 0xffffffc0) != 0) {
              uVar9 = 0;
              do {
                if (uVar9 == 0) {
                  if (p->nFansAlloc <= *(int *)(uVar1 + 0x24)) {
                    __assert_fail("ObjId < p->nFansAlloc",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                                  ,0x1a8,"int Aig_ObjFanout0Int(Aig_Man_t *, int)");
                  }
                  iVar10 = *(int *)(uVar1 + 0x24) * 5;
                }
                else {
                  if (p->nFansAlloc <= (int)uVar4 / 2) {
                    __assert_fail("iFan/2 < p->nFansAlloc",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                                  ,0x1a9,"int Aig_ObjFanoutNext(Aig_Man_t *, int)");
                  }
                  iVar10 = ((int)uVar4 >> 1) * 5 + (uVar4 & 1) + 3;
                }
                pVVar3 = p->vObjs;
                uVar4 = p->pFanData[iVar10];
                if (pVVar3 == (Vec_Ptr_t *)0x0) {
                  Entry = (void *)0x0;
                }
                else {
                  uVar13 = (int)uVar4 >> 1;
                  if (((int)uVar13 < 0) || (pVVar3->nSize <= (int)uVar13)) {
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                  }
                  Entry = pVVar3->pArray[uVar13];
                }
                uVar2 = *(ulong *)((long)Entry + 0x18);
                if (((uVar2 & 0x10) == 0) && (((uint)uVar2 & 7) - 5 < 2)) {
                  if (((ulong)Entry & 1) != 0) goto LAB_006cab39;
                  uVar13 = (uint)(uVar2 >> 0x20);
                  if ((uVar13 & 0xffffff) < uVar7) {
                    __assert_fail("Aig_ObjLevel(pFanout) >= Lev",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTiming.c"
                                  ,0xe4,"void Aig_ManUpdateLevel(Aig_Man_t *, Aig_Obj_t *)");
                  }
                  Vec_VecPush(p->vLevels,uVar13 & 0xffffff,Entry);
                  *(byte *)((long)Entry + 0x18) = *(byte *)((long)Entry + 0x18) | 0x10;
                }
                uVar9 = uVar9 + 1;
              } while (uVar9 < *(uint *)(uVar1 + 0x18) >> 6);
            }
          }
          lVar12 = lVar12 + 1;
          pVVar5 = p->vLevels;
          if ((long)pVVar5->nSize <= (long)uVar7) goto LAB_006cab96;
        }
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)p->vLevels->nSize);
    }
  }
  return;
}

Assistant:

void Aig_ManUpdateLevel( Aig_Man_t * p, Aig_Obj_t * pObjNew )
{
    Aig_Obj_t * pFanout, * pTemp;
    int iFanout = -1, LevelOld, Lev, k, m;
    assert( p->pFanData != NULL );
    assert( Aig_ObjIsNode(pObjNew) );
    // allocate level if needed
    if ( p->vLevels == NULL )
        p->vLevels = Vec_VecAlloc( Aig_ManLevels(p) + 8 );
    // check if level has changed
    LevelOld = Aig_ObjLevel(pObjNew);
    if ( LevelOld == Aig_ObjLevelNew(pObjNew) )
        return;
    // start the data structure for level update
    // we cannot fail to visit a node when using this structure because the 
    // nodes are stored by their _old_ levels, which are assumed to be correct
    Vec_VecClear( p->vLevels );
    Vec_VecPush( p->vLevels, LevelOld, pObjNew );
    pObjNew->fMarkA = 1;
    // recursively update level
    Vec_VecForEachEntryStart( Aig_Obj_t *, p->vLevels, pTemp, Lev, k, LevelOld )
    {
        pTemp->fMarkA = 0;
        assert( Aig_ObjLevel(pTemp) == Lev );
        pTemp->Level = Aig_ObjLevelNew(pTemp);
        // if the level did not change, no need to check the fanout levels
        if ( Aig_ObjLevel(pTemp) == Lev )
            continue;
        // schedule fanout for level update
        Aig_ObjForEachFanout( p, pTemp, pFanout, iFanout, m )
        {
            if ( Aig_ObjIsNode(pFanout) && !pFanout->fMarkA )
            {
                assert( Aig_ObjLevel(pFanout) >= Lev );
                Vec_VecPush( p->vLevels, Aig_ObjLevel(pFanout), pFanout );
                pFanout->fMarkA = 1;
            }
        }
    }
}